

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Huffman.h
# Opt level: O2

void __thiscall HuffmanDecoder::HuffmanDecoder(HuffmanDecoder *this,string *message)

{
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)message);
  Cryptor::Cryptor(&this->super_Cryptor,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_Cryptor)._vptr_Cryptor = (_func_int **)&PTR__HuffmanDecoder_00110b98;
  (this->nodes_).
  super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->nodes_;
  (this->nodes_).
  super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->nodes_;
  (this->nodes_).
  super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>.
  _M_impl._M_node._M_size = 0;
  return;
}

Assistant:

explicit HuffmanDecoder(const std::string& message) : Cryptor(message) {}